

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

void slang::ast::GenvarSymbol::fromSyntax
               (Scope *parent,GenvarDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::GenvarSymbol_*> *results)

{
  Compilation *this;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  Symbol *this_00;
  ulong uVar3;
  long lVar4;
  string_view sVar5;
  GenvarSymbol *genvar;
  Token name;
  SourceLocation local_60;
  string_view local_58;
  Token local_48;
  
  uVar3 = (syntax->identifiers).elements._M_extent._M_extent_value + 1;
  if (1 < uVar3) {
    this = parent->compilation;
    uVar3 = uVar3 >> 1;
    lVar4 = 0;
    do {
      ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->identifiers).elements._M_ptr)->
                                   super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar4));
      pSVar1 = *ppSVar2;
      local_48._0_8_ = *(undefined8 *)(pSVar1 + 1);
      local_48.info = (Info *)pSVar1[1].parent;
      sVar5 = parsing::Token::valueText(&local_48);
      if (sVar5._M_len != 0) {
        local_58 = parsing::Token::valueText(&local_48);
        local_60 = parsing::Token::location(&local_48);
        this_00 = &BumpAllocator::
                   emplace<slang::ast::GenvarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                             (&this->super_BumpAllocator,&local_58,&local_60)->super_Symbol;
        local_58._M_len = (size_t)this_00;
        this_00->originatingSyntax = pSVar1;
        syntax_00._M_ptr =
             (syntax->super_MemberSyntax).attributes.
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
        syntax_00._M_extent._M_extent_value =
             (syntax->super_MemberSyntax).attributes.
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
             _M_extent_value;
        Symbol::setAttributes(this_00,parent,syntax_00);
        SmallVectorBase<slang::ast::GenvarSymbol_const*>::
        emplace_back<slang::ast::GenvarSymbol_const*const&>
                  ((SmallVectorBase<slang::ast::GenvarSymbol_const*> *)results,
                   (GenvarSymbol **)&local_58);
      }
      lVar4 = lVar4 + 0x30;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void GenvarSymbol::fromSyntax(const Scope& parent, const GenvarDeclarationSyntax& syntax,
                              SmallVectorBase<const GenvarSymbol*>& results) {
    auto& comp = parent.getCompilation();
    for (auto id : syntax.identifiers) {
        auto name = id->identifier;
        if (name.valueText().empty())
            continue;

        auto genvar = comp.emplace<GenvarSymbol>(name.valueText(), name.location());
        genvar->setSyntax(*id);
        genvar->setAttributes(parent, syntax.attributes);
        results.push_back(genvar);
    }
}